

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

uint64_t helper_cvd(int32_t reg)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = (ulong)((uint)reg >> 0x1f) | 0xc;
  if (reg != 0) {
    uVar4 = (ulong)(uint)-reg;
    if (0 < reg) {
      uVar4 = (ulong)(uint)reg;
    }
    uVar3 = 4;
    do {
      uVar2 = uVar4 % 10 << ((byte)uVar3 & 0x3f) | uVar2;
      if (0x3b < uVar3) {
        return uVar2;
      }
      uVar3 = uVar3 + 4;
      bVar1 = 9 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

uint64_t HELPER(cvd)(int32_t reg)
{
    /* positive 0 */
    uint64_t dec = 0x0c;
    int64_t bin = reg;
    int shift;

    if (bin < 0) {
        bin = -bin;
        dec = 0x0d;
    }

    for (shift = 4; (shift < 64) && bin; shift += 4) {
        dec |= (bin % 10) << shift;
        bin /= 10;
    }

    return dec;
}